

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenuPrivate::drawTearOff(QMenuPrivate *this,QPainter *painter,QRect *rect)

{
  bool bVar1;
  QMenu *pQVar2;
  QStyle *pQVar3;
  QWidget *in_RDX;
  QStyleOption *in_RSI;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  QMenu *q;
  QStyleOptionMenuItem menuOpt;
  undefined4 in_stack_ffffffffffffff28;
  StateFlag in_stack_ffffffffffffff2c;
  undefined1 local_a0 [8];
  QFlags<QStyle::StateFlag> local_98 [2];
  undefined8 local_90;
  undefined8 local_88;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_20;
  undefined4 local_1c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RSI != (QStyleOption *)0x0) && (bVar1 = QRect::isEmpty((QRect *)in_RDI), !bVar1)) &&
     ((*(ushort *)&in_RDI->field_0x420 >> 9 & 1) != 0)) {
    pQVar2 = q_func(in_RDI);
    memset(local_a0,0xaa,0x98);
    QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)0x64324e);
    QStyleOption::initFrom(in_RSI,in_RDX);
    QFlags<QStyle::StateFlag>::QFlags((QFlags<QStyle::StateFlag> *)in_RDI,in_stack_ffffffffffffff2c)
    ;
    local_5c = 0;
    local_20 = 0;
    local_1c = 0;
    local_90 = *(undefined8 *)in_RDX;
    local_88 = *(undefined8 *)&in_RDX->field_0x8;
    local_60 = 5;
    if ((*(ushort *)&in_RDI->field_0x420 >> 0xb & 1) != 0) {
      QFlags<QStyle::StateFlag>::operator|=(local_98,State_Selected);
    }
    QPainter::setClipRect((QRect *)in_RSI,(int)local_a0 + 0x10);
    pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                           );
    (**(code **)(*(long *)pQVar3 + 0xb8))(pQVar3,0x12,local_a0,in_RSI,pQVar2);
    QStyleOptionMenuItem::~QStyleOptionMenuItem((QStyleOptionMenuItem *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::drawTearOff(QPainter *painter, const QRect &rect)
{
    if (!painter || rect.isEmpty())
        return;

    if (!tearoff)
        return;

    Q_Q(QMenu);
    QStyleOptionMenuItem menuOpt;
    menuOpt.initFrom(q);
    menuOpt.state = QStyle::State_None;
    menuOpt.checkType = QStyleOptionMenuItem::NotCheckable;
    menuOpt.maxIconWidth = 0;
    menuOpt.reservedShortcutWidth = 0;
    menuOpt.rect = rect;
    menuOpt.menuItemType = QStyleOptionMenuItem::TearOff;
    if (tearoffHighlighted)
        menuOpt.state |= QStyle::State_Selected;

    painter->setClipRect(menuOpt.rect);
    q->style()->drawControl(QStyle::CE_MenuTearoff, &menuOpt, painter, q);
}